

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::TracingServiceState::TracingServiceState(TracingServiceState *this)

{
  TracingServiceState *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__TracingServiceState_009c0ff8
  ;
  std::
  vector<perfetto::protos::gen::TracingServiceState_Producer,_std::allocator<perfetto::protos::gen::TracingServiceState_Producer>_>
  ::vector(&this->producers_);
  std::
  vector<perfetto::protos::gen::TracingServiceState_DataSource,_std::allocator<perfetto::protos::gen::TracingServiceState_DataSource>_>
  ::vector(&this->data_sources_);
  std::
  vector<perfetto::protos::gen::TracingServiceState_TracingSession,_std::allocator<perfetto::protos::gen::TracingServiceState_TracingSession>_>
  ::vector(&this->tracing_sessions_);
  this->supports_tracing_sessions_ = false;
  this->num_sessions_ = 0;
  this->num_sessions_started_ = 0;
  ::std::__cxx11::string::string((string *)&this->tracing_service_version_);
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<8UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

TracingServiceState::TracingServiceState() = default;